

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

char * signalForMember(char *member)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *local_48;
  char *pcStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedSignature((char *)&local_48);
  lVar4 = 0;
  pcVar2 = "2accepted()";
  while( true ) {
    pcVar3 = pcStack_40;
    if (pcStack_40 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    cVar1 = QMetaObject::checkConnectArgs
                      (*(char **)((long)&PTR_anon_var_dwarf_14b1634_008041e8 + lVar4),pcVar3);
    if (cVar1 != '\0') break;
    lVar4 = lVar4 + 8;
    if ((int)lVar4 == 0x18) {
LAB_004ff364:
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return pcVar2;
    }
  }
  pcVar2 = *(char **)((long)&PTR_anon_var_dwarf_14b1634_008041e8 + lVar4);
  goto LAB_004ff364;
}

Assistant:

static const char *signalForMember(const char *member)
{
    QByteArray normalizedMember(QMetaObject::normalizedSignature(member));

    for (int i = 0; i < NumCandidateSignals; ++i)
        if (QMetaObject::checkConnectArgs(candidateSignal(i), normalizedMember))
            return candidateSignal(i);

    // otherwise, use fit-all accepted signal:
    return SIGNAL(accepted());
}